

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodySharedMass.cpp
# Opt level: O1

void __thiscall
chrono::ChVariablesBodySharedMass::DiagonalAdd
          (ChVariablesBodySharedMass *this,ChVectorRef *result,double c_a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  long lVar8;
  ChSharedMassBody *pCVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar17;
  ulong uVar18;
  undefined8 in_XMM0_Qb;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  uVar7 = (this->super_ChVariablesBody).super_ChVariables.offset;
  lVar17 = (long)(int)uVar7;
  if ((-1 < lVar17) &&
     (lVar8 = *(long *)&(result->
                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                        ).field_0x8, lVar17 < lVar8)) {
    pCVar9 = this->sharedmass;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = pCVar9->mass;
    uVar18 = (ulong)uVar7;
    lVar10 = *(long *)&result->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    ;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(lVar10 + lVar17 * 8);
    auVar11._8_8_ = in_XMM0_Qb;
    auVar11._0_8_ = c_a;
    auVar1 = vfmadd213sd_fma(auVar19,auVar11,auVar1);
    *(long *)(lVar10 + lVar17 * 8) = auVar1._0_8_;
    if ((long)(uVar18 + 1) < lVar8) {
      auVar20._8_8_ = 0;
      auVar20._0_8_ = pCVar9->mass;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(lVar10 + 8 + uVar18 * 8);
      auVar12._8_8_ = in_XMM0_Qb;
      auVar12._0_8_ = c_a;
      auVar1 = vfmadd213sd_fma(auVar20,auVar12,auVar2);
      *(long *)(lVar10 + 8 + uVar18 * 8) = auVar1._0_8_;
      if ((long)(uVar18 + 2) < lVar8) {
        auVar21._8_8_ = 0;
        auVar21._0_8_ = pCVar9->mass;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = *(ulong *)(lVar10 + 0x10 + uVar18 * 8);
        auVar13._8_8_ = in_XMM0_Qb;
        auVar13._0_8_ = c_a;
        auVar1 = vfmadd213sd_fma(auVar21,auVar13,auVar3);
        *(long *)(lVar10 + 0x10 + uVar18 * 8) = auVar1._0_8_;
        uVar18 = (ulong)(uVar7 + 3);
        if ((long)uVar18 < lVar8) {
          auVar22._8_8_ = 0;
          auVar22._0_8_ =
               (pCVar9->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(lVar10 + uVar18 * 8);
          auVar14._8_8_ = in_XMM0_Qb;
          auVar14._0_8_ = c_a;
          auVar1 = vfmadd213sd_fma(auVar22,auVar14,auVar4);
          *(long *)(lVar10 + uVar18 * 8) = auVar1._0_8_;
          uVar18 = (ulong)(uVar7 + 4);
          if ((long)uVar18 < lVar8) {
            auVar23._8_8_ = 0;
            auVar23._0_8_ =
                 (pCVar9->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)(lVar10 + uVar18 * 8);
            auVar15._8_8_ = in_XMM0_Qb;
            auVar15._0_8_ = c_a;
            auVar1 = vfmadd213sd_fma(auVar23,auVar15,auVar5);
            *(long *)(lVar10 + uVar18 * 8) = auVar1._0_8_;
            uVar18 = (ulong)(uVar7 + 5);
            if ((long)uVar18 < lVar8) {
              auVar24._8_8_ = 0;
              auVar24._0_8_ =
                   (pCVar9->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
              auVar6._8_8_ = 0;
              auVar6._0_8_ = *(ulong *)(lVar10 + uVar18 * 8);
              auVar16._8_8_ = in_XMM0_Qb;
              auVar16._0_8_ = c_a;
              auVar1 = vfmadd213sd_fma(auVar24,auVar16,auVar6);
              *(long *)(lVar10 + uVar18 * 8) = auVar1._0_8_;
              return;
            }
          }
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
               );
}

Assistant:

void ChVariablesBodySharedMass::DiagonalAdd(ChVectorRef result, const double c_a) const {
    result(this->offset + 0) += c_a * sharedmass->mass;
    result(this->offset + 1) += c_a * sharedmass->mass;
    result(this->offset + 2) += c_a * sharedmass->mass;
    result(this->offset + 3) += c_a * sharedmass->inertia(0, 0);
    result(this->offset + 4) += c_a * sharedmass->inertia(1, 1);
    result(this->offset + 5) += c_a * sharedmass->inertia(2, 2);
}